

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ekf.hpp
# Opt level: O0

void __thiscall EKF::observe(EKF *this,Vector3f *obs_p,Quaternionf *obs_q)

{
  double __x;
  Quaternion<float,_0> local_4f8;
  Type local_4e0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>
  local_4a8;
  Type local_460;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_428;
  Type local_3e0;
  Matrix<float,3,1,0,3,1> local_3a4 [12];
  undefined1 local_398 [8];
  Quaternionf dq;
  non_const_type local_380;
  Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>
  local_378;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
  local_368;
  undefined1 local_350 [8];
  VectorXf dx;
  IdentityReturnType local_308;
  MatrixTypeNested local_2f0;
  Solve<Eigen::TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  local_2e8;
  undefined1 local_2d8 [8];
  MatrixXf Sui;
  undefined1 local_288 [8];
  MatrixXf Su;
  undefined1 local_238 [8];
  MatrixXf Kt;
  Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>
  local_218;
  undefined1 local_208 [8];
  MatrixXf R;
  HouseholderSequenceType local_1b0;
  undefined1 local_188 [8];
  MatrixXf Q;
  Type local_138;
  non_const_type local_100;
  Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>
  local_f8;
  Type local_e8;
  int local_b0 [2];
  undefined1 local_a8 [8];
  MatrixXf QR;
  MatrixXf H;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  local_48;
  undefined1 local_30 [8];
  VectorXf error;
  Quaternionf *obs_q_local;
  Vector3f *obs_p_local;
  EKF *this_local;
  
  error.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)obs_q;
  toVec((EKF *)local_58,&this->gravity,(Quaternionf *)obs_p);
  toVec((EKF *)local_68,&this->gravity,(Quaternionf *)&this->pos);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)(local_58 + 0x10),(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_58,
             (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_68);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
            ((Matrix<float,_1,1,0,_1,1> *)local_30,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)(local_58 + 0x10));
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_68);
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_58);
  calcH((MatrixXf *)
        &QR.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols,this,
        &this->qua);
  local_b0[1] = 0x10;
  local_b0[0] = 0x10;
  Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<float,_1,_1,0,_1,_1> *)local_a8,local_b0 + 1,local_b0);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_a8);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topLeftCorner<int,int>
            (&local_e8,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_a8,7,7);
  Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false> *)&local_e8,
             (DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&this->Wu);
  local_100 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
                         &QR.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
  local_f8 = Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&this->Pu,
                        (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *)
                        &local_100);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::bottomLeftCorner<int,int>
            (&local_138,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_a8,9,7);
  Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false> *)&local_138,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_f8);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::bottomRightCorner<int,int>
            ((Type *)&Q.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_a8,9,9);
  Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false> *)
             &Q.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&this->Pu);
  Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::householderQr
            ((HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
             &R.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_a8);
  Eigen::HouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::householderQ
            (&local_1b0,
             (HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
             &R.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::HouseholderSequence<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,1>>
            ((Matrix<float,_1,_1,0,_1,_1> *)local_188,
             (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1>_>
              *)&local_1b0);
  Eigen::HouseholderQR<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
            ((HouseholderQR<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
             &R.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Kt.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_188);
  local_218 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)
                         &Kt.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols,
                         (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_a8);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
            ((Matrix<float,_1,_1,0,_1,_1> *)local_208,
             (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>_>
              *)&local_218);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topRightCorner<int,int>
            ((Type *)&Su.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_208,7,9);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<float,_1,_1,0,_1,_1> *)local_238,
             (EigenBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &Su.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::topLeftCorner<int,int>
            ((Type *)&Sui.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_208,7,7);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<float,_1,_1,0,_1,_1> *)local_288,
             (EigenBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &Sui.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  local_2f0 = (MatrixTypeNested)
              Eigen::MatrixBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::triangularView<2u>
                        ((MatrixBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_288);
  Eigen::MatrixBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_308,7,7);
  local_2e8 = Eigen::TriangularView<Eigen::Matrix<float,-1,-1,0,-1,-1>,2u>::
              solve<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>
                        ((TriangularView<Eigen::Matrix<float,_1,_1,0,_1,_1>,2u> *)&local_2f0,
                         (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                          *)&local_308);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::
  Matrix<Eigen::Solve<Eigen::TriangularView<Eigen::Matrix<float,_1,_1,0,_1,_1>,2u>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>>
            ((Matrix<float,_1,_1,0,_1,_1> *)local_2d8,
             (EigenBase<Eigen::Solve<Eigen::TriangularView<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2U>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
              *)&local_2e8);
  Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::bottomRightCorner<int,int>
            ((Type *)&dx.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)local_208,9,9);
  Eigen::Matrix<float,-1,-1,0,-1,-1>::operator=
            ((Matrix<float,_1,_1,0,_1,_1> *)&this->Pu,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &dx.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  local_380 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_238);
  local_378 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)
                         &local_380,
                         (MatrixBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_2d8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>,Eigen::Matrix<float,-1,-1,0,-1,-1>,0>>
  ::operator*(&local_368,
              (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>>
               *)&local_378,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_30);
  Eigen::Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,_1,0,_1,_1>,0>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
            ((Matrix<float,_1,1,0,_1,1> *)local_350,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
              *)&local_368);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::bottomRows<int>
            (&local_3e0,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_350,3);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,1,false>>
            (local_3a4,
             (EigenBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_3e0);
  exp((EKF *)local_398,__x);
  Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::topRows<int>
            (&local_460,(DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_350,3);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator+
            (&local_428,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&this->pos,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_460);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)&this->pos,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
              *)&local_428);
  Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::block<int,int>
            (&local_4e0,(DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_350,3,0,3,1);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator+
            (&local_4a8,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&this->vel,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)
             &local_4e0);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)&this->vel,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_>_>
              *)&local_4a8);
  Eigen::QuaternionBase<Eigen::Quaternion<float,0>>::operator*
            ((QuaternionBase<Eigen::Quaternion<float,0>> *)&local_4f8,
             (QuaternionBase<Eigen::Quaternion<float,_0>_> *)&this->qua);
  Eigen::Quaternion<float,_0>::operator=(&this->qua,&local_4f8);
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_350);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_2d8);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_288);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_238);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_208);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_188);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<float,__1,__1,_0,__1,__1> *)local_a8);
  Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<float,__1,__1,_0,__1,__1> *)
             &QR.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_30);
  return;
}

Assistant:

void observe(const Eigen::Vector3f& obs_p, const Eigen::Quaternionf& obs_q)
  {
    // inovation residual vector (7x1)
    Eigen::VectorXf error = toVec(obs_p, obs_q) - toVec(pos, qua);

    // observation jacobian (7x9)
    Eigen::MatrixXf H = calcH(qua);

    // QR decompose
    Eigen::MatrixXf QR(16, 16);
    QR.setZero();
    QR.topLeftCorner(7, 7) = Wu;
    QR.bottomLeftCorner(9, 7) = Pu * H.transpose();  // (9x7)=(9x9)*(9x7)
    QR.bottomRightCorner(9, 9) = Pu;
    Eigen::MatrixXf Q = QR.householderQr().householderQ();  // (16x16)
    Eigen::MatrixXf R = Q.transpose() * QR;                 // (16x16)

    Eigen::MatrixXf Kt = R.topRightCorner(7, 9);             // (7x9) upper trianguler matrix of the modified Kalman gain
    Eigen::MatrixXf Su = R.topLeftCorner(7, 7);              // (7x7) upper trianguler matrix of the inovation matrix
    Eigen::MatrixXf Sui = Su.triangularView<Eigen::Upper>()  // (7x7) inverse of the upper trianguler of the inovation matrix
                              .solve(Eigen::MatrixXf::Identity(7, 7));

    // update variance covariance matrix
    Pu = R.bottomRightCorner(9, 9);

    Eigen::VectorXf dx = (Kt.transpose() * Sui) * error;  // (9x1)=(9x7)*(7x7)*(7x1)

    // updata state vector
    Eigen::Quaternionf dq = exp(dx.bottomRows(3));
    pos = pos + dx.topRows(3);
    vel = vel + dx.block(3, 0, 3, 1);
    qua = qua * dq;
  }